

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ArrayPtr<const_kj::CidrRange> kj::_::localCidrs(void)

{
  int iVar1;
  size_t size;
  StringPtr SVar2;
  ArrayPtr<const_kj::CidrRange> AVar3;
  
  if (localCidrs()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&localCidrs()::result);
    if (iVar1 != 0) {
      SVar2 = operator____kj("127.0.0.0/8",0xb);
      CidrRange::CidrRange((CidrRange *)localCidrs()::result,SVar2);
      SVar2 = operator____kj("::1/128",7);
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x18),SVar2);
      SVar2 = operator____kj("0.0.0.0/32",10);
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x30),SVar2);
      SVar2 = operator____kj("::/128",6);
      CidrRange::CidrRange((CidrRange *)(localCidrs()::result + 0x48),SVar2);
      __cxa_guard_release(&localCidrs()::result);
    }
  }
  size = size<kj::CidrRange_const,4ul>(localCidrs()::result);
  AVar3 = arrayPtr<kj::CidrRange_const>((CidrRange *)localCidrs()::result,size);
  return AVar3;
}

Assistant:

ArrayPtr<const CidrRange> localCidrs() {
  static const CidrRange result[] = {
    // localhost
    "127.0.0.0/8"_kj,
    "::1/128"_kj,

    // Trying to *connect* to 0.0.0.0 on many systems is equivalent to connecting to localhost.
    // (wat)
    "0.0.0.0/32"_kj,
    "::/128"_kj,
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents result from implicitly
  //   casting to our return type.
  return kj::arrayPtr(result, kj::size(result));
}